

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O2

bool __thiscall CGameControllerCTF::CanBeMovedOnBalance(CGameControllerCTF *this,int ClientID)

{
  CCharacter *pCVar1;
  int fi;
  long lVar2;
  bool bVar3;
  
  pCVar1 = CPlayer::GetCharacter
                     (((this->super_IGameController).m_pGameServer)->m_apPlayers[ClientID]);
  if (pCVar1 == (CCharacter *)0x0) {
    bVar3 = true;
  }
  else {
    lVar2 = 0;
    while ((bVar3 = lVar2 == 2, !bVar3 &&
           ((this->m_apFlags[lVar2] == (CFlag *)0x0 ||
            (this->m_apFlags[lVar2]->m_pCarrier != pCVar1))))) {
      lVar2 = lVar2 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool CGameControllerCTF::CanBeMovedOnBalance(int ClientID) const
{
	CCharacter* Character = GameServer()->m_apPlayers[ClientID]->GetCharacter();
	if(Character)
	{
		for(int fi = 0; fi < 2; fi++)
		{
			CFlag *F = m_apFlags[fi];
			if(F && F->GetCarrier() == Character)
				return false;
		}
	}
	return true;
}